

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<llvm::DWARFFormValue> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFFormValue>::operator=
          (SmallVectorImpl<llvm::DWARFFormValue> *this,SmallVectorImpl<llvm::DWARFFormValue> *RHS)

{
  bool bVar1;
  iterator pDVar2;
  iterator pDVar3;
  iterator MinSize;
  iterator pDVar4;
  iterator pDVar5;
  DWARFFormValue *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<llvm::DWARFFormValue> *RHS_local;
  SmallVectorImpl<llvm::DWARFFormValue> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::isSmall
                      ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
    if (bVar1) {
      MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
      NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
      if (NewEnd < MinSize) {
        pDVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
        if (pDVar4 < MinSize) {
          pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
          pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
          SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::destroy_range(pDVar2,pDVar3);
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::grow
                    (&this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>,
                     (size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
          pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
          pDVar5 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
          std::move<llvm::DWARFFormValue*,llvm::DWARFFormValue*>
                    (pDVar2,pDVar3 + (long)NewEnd,pDVar5);
        }
        pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar5 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFFormValue,true>::
        uninitialized_move<llvm::DWARFFormValue*,llvm::DWARFFormValue*>
                  (pDVar2 + (long)NewEnd,pDVar3,pDVar5 + (long)NewEnd);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
      else {
        local_38 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        if (MinSize != (iterator)0x0) {
          pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
          pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
          local_38 = std::move<llvm::DWARFFormValue*,llvm::DWARFFormValue*>(pDVar2,pDVar3,local_38);
        }
        pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::destroy_range(local_38,pDVar2);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
    }
    else {
      pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::destroy_range(pDVar2,pDVar3);
      bVar1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::isSmall
                        ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      if (!bVar1) {
        pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        free(pDVar2);
      }
      (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
           Capacity;
      SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::resetToSmall
                ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}